

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O1

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleParamNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  int iVar1;
  Property *pPVar2;
  Value *this_00;
  char *pcVar3;
  long lVar4;
  float fVar5;
  string local_40;
  
  if (node != (DDLNode *)0x0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"attrib","");
    pPVar2 = ODDLParser::DDLNode::findPropertyByName(node,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if (((pPVar2 != (Property *)0x0) && (pPVar2->m_value != (Value *)0x0)) &&
       (this_00 = ODDLParser::DDLNode::getValue(node), this_00 != (Value *)0x0)) {
      fVar5 = ODDLParser::Value::getFloat(this_00);
      pcVar3 = ODDLParser::Value::getString(pPVar2->m_value);
      if (pcVar3 == (char *)0x0) {
LAB_004c9120:
        __assert_fail("__null != s2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/StringComparison.h"
                      ,0xc0,"int Assimp::ASSIMP_strincmp(const char *, const char *, unsigned int)")
        ;
      }
      iVar1 = strncasecmp("fov",pcVar3,3);
      if (iVar1 == 0) {
        lVar4 = 0x428;
      }
      else {
        pcVar3 = ODDLParser::Value::getString(pPVar2->m_value);
        if (pcVar3 == (char *)0x0) goto LAB_004c9120;
        iVar1 = strncasecmp("near",pcVar3,4);
        if (iVar1 == 0) {
          lVar4 = 0x42c;
        }
        else {
          pcVar3 = ODDLParser::Value::getString(pPVar2->m_value);
          if (pcVar3 == (char *)0x0) goto LAB_004c9120;
          iVar1 = strncasecmp("far",pcVar3,3);
          if (iVar1 != 0) {
            return;
          }
          lVar4 = 0x430;
        }
      }
      *(float *)((this->m_currentCamera->mName).data + lVar4 + -4) = fVar5;
    }
  }
  return;
}

Assistant:

void OpenGEXImporter::handleParamNode( ODDLParser::DDLNode *node, aiScene * /*pScene*/ ) {
    if ( nullptr == node ) {
        return;
    }

    Property *prop = node->findPropertyByName( "attrib" );
    if ( nullptr == prop ) {
        return;
    }

    if ( nullptr != prop->m_value ) {
        Value *val( node->getValue() );
        if ( nullptr == val ) {
            return;
        }
        const float floatVal( val->getFloat() );
        if ( 0 == ASSIMP_strincmp( "fov", prop->m_value->getString(), 3 ) ) {
            m_currentCamera->mHorizontalFOV = floatVal;
        } else if ( 0 == ASSIMP_strincmp( "near", prop->m_value->getString(), 4 ) ) {
            m_currentCamera->mClipPlaneNear = floatVal;
        } else if ( 0 == ASSIMP_strincmp( "far", prop->m_value->getString(), 3 ) ) {
            m_currentCamera->mClipPlaneFar = floatVal;
        }
    }
}